

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int argument(object *proc,int parBlkSize,object *currentParam)

{
  int index;
  long lVar1;
  int *piVar2;
  object *poVar3;
  typeDesc *ptVar4;
  typeDesc *ptVar5;
  ulong uVar6;
  ulong uVar7;
  char *msg;
  int iVar8;
  
  if (currentSymbol < 0x268) {
    if (currentSymbol == 0x25f) {
      piVar2 = &intTypeIndex;
    }
    else {
      if (currentSymbol != 0x261) {
LAB_00105f10:
        msg = "bad argument";
        goto LAB_00105f32;
      }
      piVar2 = &charTypeIndex;
    }
LAB_00105cd2:
    index = *piVar2;
    getSymbol();
    if (currentSymbol != 0x1f5) {
LAB_00105efe:
      msg = "missing identifier";
LAB_00105f32:
      mark(msg);
      exit(-1);
    }
    if (proc->hasPrototype == 1) {
      uVar6 = 0xffffffffffffffff;
      do {
        lVar1 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (idName[lVar1] != '\0');
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 1;
        if (1 < (int)uVar6) {
          uVar7 = uVar6 & 0xffffffff;
        }
        uVar6 = 0;
        do {
          currentParam->name[uVar6] = idName[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      currentParam->name[uVar6] = '\0';
      poVar3 = (object *)0x0;
    }
    else {
      poVar3 = newObj(0x2c1);
      poVar3->typeIndex = index;
    }
    ptVar4 = getType(index);
    iVar8 = ptVar4->size;
    getSymbol();
    if (currentSymbol != 0x130) {
      if ((proc->hasPrototype == 1) && (currentParam->typeIndex != index)) {
        msg = "type mismatch in prototype or declaration";
        goto LAB_00105f32;
      }
      goto LAB_00105ee9;
    }
    getSymbol();
    if (currentSymbol != 0x12f) {
      msg = "missing right bracket";
      goto LAB_00105f32;
    }
    if (proc->hasPrototype == 1) {
      ptVar4 = getType(currentParam->typeIndex);
      if ((ptVar4->form != 0x322) || (iVar8 = 0xc, ptVar4->base->index != index)) {
        msg = "type mismatch in prototype and declaration";
        goto LAB_00105f32;
      }
    }
    else {
      ptVar4 = newType();
      ptVar4->form = 0x322;
      ptVar5 = getType(index);
      ptVar4->base = ptVar5;
      ptVar4->size = 0xc;
      poVar3->typeIndex = ptVar4->index;
      poVar3->cl = 0x2c5;
      iVar8 = 0xc;
    }
  }
  else {
    if (currentSymbol != 0x268) {
      if (currentSymbol != 0x26d) goto LAB_00105f10;
      piVar2 = &boolTypeIndex;
      goto LAB_00105cd2;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) goto LAB_00105efe;
    getSymbol();
    poVar3 = find();
    ptVar4 = getType(poVar3->typeIndex);
    if (currentSymbol != 99) {
      msg = "bad struct variable";
      goto LAB_00105f32;
    }
    getSymbol();
    if (currentSymbol != 0x1f5) {
      msg = "missing variable name";
      goto LAB_00105f32;
    }
    if (proc->hasPrototype == 1) {
      uVar6 = 0xffffffffffffffff;
      do {
        lVar1 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (idName[lVar1] != '\0');
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar7 = 1;
        if (1 < (int)uVar6) {
          uVar7 = uVar6 & 0xffffffff;
        }
        uVar6 = 0;
        do {
          currentParam->name[uVar6] = idName[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      currentParam->name[uVar6] = '\0';
      iVar8 = 4;
      if (currentParam->typeIndex != ptVar4->refIndex) {
        msg = "type mismatch in prototype/declaration";
        goto LAB_00105f32;
      }
    }
    else {
      poVar3 = newObj(0x2c5);
      poVar3->typeIndex = ptVar4->refIndex;
      iVar8 = 4;
    }
  }
  getSymbol();
LAB_00105ee9:
  return iVar8 + parBlkSize;
}

Assistant:

procedure 
int argument(struct object *proc, int parBlkSize, struct object *currentParam)  {
	variable struct object *obj;
	variable struct typeDesc *type; variable struct typeDesc *tp;
	variable int tpIndex; variable int parSize;
	obj = NULL; tp = NULL; type = NULL; parSize = 0;tpIndex=0;
	
	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) {
		if (currentSymbol == SYMBOL_INT){
			tpIndex = intTypeIndex;
		} elsif (currentSymbol == SYMBOL_CHAR){
			tpIndex = charTypeIndex;
		} elsif (currentSymbol == SYMBOL_BOOL) {
			tpIndex = boolTypeIndex;
		}
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) { /* int x */
			if (proc->hasPrototype == true) {
				stringCopy(idName,currentParam->name); 
			} else { 
				obj = newObj(CLASS_VAR); 
				obj->typeIndex = tpIndex;
			}
			type = getType(tpIndex);
			parSize = parBlkSize + type->size;
			getSymbol();
			if (currentSymbol == SYMBOL_LBRAK) {
				getSymbol();
				if (currentSymbol == SYMBOL_RBRAK) { /* we have an array, such as char a[] */
					if (proc->hasPrototype == true) { /* check consistency */
						type = getType(currentParam->typeIndex);
						if ((type->form != FORM_ARRAY) || (type->base->index != tpIndex))  { /* check form, base (differ) */
							mark("type mismatch in prototype and declaration");
							exit(-1);
						}
					} else {
						tp = newType();
						tp->form = FORM_ARRAY;
						type = getType(tpIndex);
						tp->base = type;
						tp->size = wordSize + 8; /* adr + len + onstack */ 
						obj->typeIndex = tp->index;
						obj->cl = CLASS_PAR; 
					}
					parSize = parBlkSize + wordSize + 8;
					getSymbol();
				} else {
					mark("missing right bracket");
					exit(-1);
				}
			} else { /* consistency type check for non-array vars */
				if (proc->hasPrototype == true) {
					if (currentParam->typeIndex != tpIndex) {
						mark("type mismatch in prototype or declaration");
						exit(-1);
					}
				}
			}
			
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			getSymbol();
			obj = find();
			type = getType(obj->typeIndex);
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol();
				if (currentSymbol == SYMBOL_IDENTIFIER) {
					if (proc->hasPrototype == true) {
						stringCopy(idName,currentParam->name);
						if (currentParam->typeIndex != type->refIndex) {
							mark("type mismatch in prototype/declaration");
							exit(-1);
						}
					} else {
						obj = newObj(CLASS_PAR);
						obj->typeIndex = type->refIndex;
					}
					parSize = parBlkSize + wordSize;
					getSymbol();
				} else {
					mark("missing variable name");
					exit(-1);
				}
			} else {
				mark("bad struct variable");
				exit(-1);
			}
		} else {
			mark("missing identifier");
			exit(-1);
		}
	} else {
		mark("bad argument");
		exit(-1);
	}
	return parSize;
}